

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O2

int TestBuildFile(ICompilerLogger *pLog,RuntimeObjectSystem *pRTObjSys,Path *file,
                 ITestBuildNotifier *callback,bool bTestFileTracking)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  filetime_t fVar4;
  filetime_t fVar5;
  undefined4 extraout_var;
  _func_int **pp_Var6;
  int iVar7;
  pointer pcVar8;
  long time_;
  undefined8 uStack_70;
  Path directory;
  pointer local_38;
  
  if (callback == (ITestBuildNotifier *)0x0) {
    __assert_fail("callback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/RuntimeCompiledCPlusPlus/Aurora/RuntimeObjectSystem/RuntimeObjectSystem.cpp"
                  ,0x380,
                  "int TestBuildFile(ICompilerLogger *, RuntimeObjectSystem *, const Path &, ITestBuildNotifier *, bool)"
                 );
  }
  if (pLog != (ICompilerLogger *)0x0) {
    (**(code **)(*(long *)pLog + 0x10))
              (pLog,"Testing change to file: %s\n",(file->m_string)._M_dataplus._M_p);
  }
  bVar1 = FileSystemUtils::Path::Exists(file);
  if (bVar1) {
    if (bTestFileTracking) {
      fVar4 = FileSystemUtils::GetCurrentTime();
      fVar5 = FileSystemUtils::Path::GetLastWriteTime(file);
      time_ = (ulong)(fVar4 == fVar5) + fVar4;
      FileSystemUtils::Path::SetLastWriteTime(file,time_);
      FileSystemUtils::Path::ParentPath(&directory,file);
      FileSystemUtils::Path::SetLastWriteTime(&directory,time_);
      iVar7 = 0x33;
      do {
        iVar7 = iVar7 + -1;
        if (iVar7 == 0) {
LAB_00110ce4:
          FileSystemUtils::Path::~Path(&directory);
          goto LAB_00110cee;
        }
        iVar3 = (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
                  _vptr_ITestBuildNotifier[0xb])(pRTObjSys);
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x30))
                  (0x3f800000,(long *)CONCAT44(extraout_var,iVar3));
        iVar3 = (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
                  _vptr_ITestBuildNotifier[5])(pRTObjSys);
        if ((char)iVar3 != '\0') goto LAB_00110ce4;
        iVar3 = (*callback->_vptr_ITestBuildNotifier[3])(callback);
      } while ((char)iVar3 != '\0');
      FileSystemUtils::Path::~Path(&directory);
    }
    else {
      AUDynArray<const_char_*>::AUDynArray((AUDynArray<const_char_*> *)&directory,0);
      local_38 = (file->m_string)._M_dataplus._M_p;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&directory.m_string,
                 &local_38);
      (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier._vptr_ITestBuildNotifier
        [0x25])(pRTObjSys,&directory);
      AUDynArray<const_char_*>::~AUDynArray((AUDynArray<const_char_*> *)&directory);
LAB_00110cee:
      iVar7 = (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
                _vptr_ITestBuildNotifier[5])(pRTObjSys);
      if ((char)iVar7 == '\0') {
        pcVar8 = (file->m_string)._M_dataplus._M_p;
        pp_Var6 = callback->_vptr_ITestBuildNotifier;
        uStack_70 = 3;
        goto LAB_00110d25;
      }
      do {
        iVar7 = (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
                  _vptr_ITestBuildNotifier[6])(pRTObjSys);
        if ((char)iVar7 != '\0') {
          iVar7 = (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
                    _vptr_ITestBuildNotifier[9])(pRTObjSys);
          iVar3 = (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
                    _vptr_ITestBuildNotifier[7])(pRTObjSys);
          if ((char)iVar3 != '\0') {
            iVar7 = (*callback->_vptr_ITestBuildNotifier[2])
                              (callback,(file->m_string)._M_dataplus._M_p,0);
            if ((char)iVar7 == '\0') {
              return -0xd1e;
            }
            return 0;
          }
          iVar3 = (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
                    _vptr_ITestBuildNotifier[9])(pRTObjSys);
          if (iVar3 == iVar7) {
            uStack_70 = 4;
          }
          else {
            uStack_70 = 5;
          }
          iVar7 = (*callback->_vptr_ITestBuildNotifier[2])
                            (callback,(file->m_string)._M_dataplus._M_p,uStack_70);
          cVar2 = (char)iVar7;
          goto LAB_00110d2c;
        }
        iVar7 = (*callback->_vptr_ITestBuildNotifier[3])(callback);
      } while ((char)iVar7 != '\0');
    }
    iVar7 = -0xd1e;
  }
  else {
    pcVar8 = (file->m_string)._M_dataplus._M_p;
    pp_Var6 = callback->_vptr_ITestBuildNotifier;
    uStack_70 = 2;
LAB_00110d25:
    iVar7 = (*pp_Var6[2])(callback,pcVar8,uStack_70);
    cVar2 = (char)iVar7;
LAB_00110d2c:
    if (cVar2 == '\0') {
      iVar7 = -1;
    }
    else {
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

static int TestBuildFile( ICompilerLogger* pLog, RuntimeObjectSystem* pRTObjSys, const Path& file,
                          ITestBuildNotifier* callback, bool bTestFileTracking )
{
    assert( callback );

    if( pLog ) { pLog->LogInfo("Testing change to file: %s\n", file.c_str()); }

    int numErrors = 0;
    if( file.Exists() )
    {
        if( bTestFileTracking )
        {
            FileSystemUtils::filetime_t currTime = FileSystemUtils::GetCurrentTime();
            FileSystemUtils::filetime_t oldModTime = file.GetLastWriteTime();
            if( currTime == oldModTime )
            {
                // some files may be auto-generated by the program, so may have just been created so won't
                // get a time change unless we force it.
                currTime += 1;
            }
            file.SetLastWriteTime( currTime );
            // we must also change the directories time, as some of our watchers watch the dir
            Path directory = file.ParentPath();
            directory.SetLastWriteTime( currTime );
            for( int i=0; i<50; ++i )
            {
                // wait up to 100 seconds (make configurable?)
                pRTObjSys->GetFileChangeNotifier()->Update( 1.0f ); // force update by using very large time delta
                if( pRTObjSys->GetIsCompiling() ) { break; }
                if( !callback->TestBuildWaitAndUpdate() )
                {
                    return -0xD1E;
                }
            }
        }
        else
        {
            AUDynArray<const char*> filelist;
            filelist.Add( file.c_str() );
            pRTObjSys->OnFileChange( filelist );
        }
        if( pRTObjSys->GetIsCompiling() )
        {
            while( !pRTObjSys->GetIsCompiledComplete() )
            {
                if( !callback->TestBuildWaitAndUpdate() )
                {
                    return -0xD1E;
                }
            }
            int numCurrLoadedModules = pRTObjSys->GetNumberLoadedModules();
            if( pRTObjSys->LoadCompiledModule() )
            {
                if( !callback->TestBuildCallback( file.c_str(), TESTBUILDRRESULT_SUCCESS ) ) { return -0xD1E; }
                return 0;
            }
            else
            {
                ++numErrors;
                if( (int)pRTObjSys->GetNumberLoadedModules() == numCurrLoadedModules )
                {
                    if( !callback->TestBuildCallback( file.c_str(), TESTBUILDRRESULT_BUILD_FAILED ) ) { return -numErrors; }
                }
                else
                {
                    // loaded the module but some other issue
                    if( !callback->TestBuildCallback( file.c_str(), TESTBUILDRRESULT_OBJECT_SWAP_FAIL ) ) { return -numErrors; }
                }
            }
        }
        else
        {
            ++numErrors;
           if( !callback->TestBuildCallback( file.c_str(), TESTBUILDRRESULT_BUILD_NOT_STARTED ) ) { return -numErrors; }
        }
    }
    else
    {
        ++numErrors;
        if( !callback->TestBuildCallback( file.c_str(), TESTBUILDRRESULT_BUILD_FILE_GONE ) ) { return -numErrors; }
    }
    return numErrors;
}